

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  ulong *puVar1;
  char cVar2;
  char cVar3;
  mbedtls_mpi_uint *pmVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_80 [8];
  mbedtls_mpi B;
  undefined1 local_50 [8];
  mbedtls_mpi T;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  T.p._0_4_ = 1;
  local_50 = (undefined1  [8])0x0;
  cVar2 = *s;
  if (cVar2 == '\0') {
    mbedtls_mpi_free(X);
    return 0;
  }
  T._8_8_ = strlen(s + (cVar2 == '-'));
  if (radix == 0x10) {
    if ((ulong)T._8_8_ >> 0x3e != 0) {
      return -4;
    }
    iVar5 = mbedtls_mpi_grow(X,(((ulong)T._8_8_ >> 4) + 1) - (ulong)((T._8_8_ & 0xf) == 0));
    if ((iVar5 != 0) || (iVar5 = mbedtls_mpi_grow(X,1), iVar5 != 0)) goto LAB_0021b59b;
    memset(X->p,0,(ulong)X->n << 3);
    pmVar4 = X->p;
    *pmVar4 = 0;
    X->s = 1;
    if (T._8_8_ != 0) {
      pcVar7 = s + (cVar2 == '-');
      bVar8 = 0;
      uVar10 = 0;
      do {
        pcVar7 = pcVar7 + -1;
        cVar3 = pcVar7[T._8_8_];
        iVar5 = (int)cVar3;
        uVar11 = (ulong)(iVar5 - 0x30);
        if (9 < (byte)(cVar3 - 0x30U)) {
          uVar11 = 0xff;
        }
        uVar12 = (ulong)(iVar5 - 0x37);
        if (5 < (byte)(cVar3 + 0xbfU)) {
          uVar12 = uVar11;
        }
        uVar11 = (ulong)(iVar5 - 0x57);
        if (5 < (byte)(cVar3 + 0x9fU)) {
          uVar11 = uVar12;
        }
        if (0xf < uVar11) goto LAB_0021b6d5;
        puVar1 = pmVar4 + (uVar10 >> 4);
        *puVar1 = *puVar1 | uVar11 << (bVar8 & 0x3c);
        uVar10 = uVar10 + 1;
        bVar8 = bVar8 + 4;
      } while (T._8_8_ != uVar10);
    }
  }
  else {
    iVar5 = mbedtls_mpi_grow(X,1);
    if (iVar5 != 0) goto LAB_0021b59b;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (T._8_8_ != 0) {
      lVar9 = 0;
      do {
        cVar3 = (s + (cVar2 == '-'))[lVar9];
        iVar5 = (int)cVar3;
        uVar10 = (ulong)(iVar5 - 0x30);
        if (9 < (byte)(cVar3 - 0x30U)) {
          uVar10 = 0xff;
        }
        uVar11 = (ulong)(iVar5 - 0x37);
        if (5 < (byte)(cVar3 + 0xbfU)) {
          uVar11 = uVar10;
        }
        uVar10 = (ulong)(iVar5 - 0x57);
        if (5 < (byte)(cVar3 + 0x9fU)) {
          uVar10 = uVar11;
        }
        if ((uint)radix <= uVar10) goto LAB_0021b6d5;
        iVar5 = mbedtls_mpi_mul_int((mbedtls_mpi *)local_50,X,(ulong)(uint)radix);
        if (iVar5 != 0) goto LAB_0021b59b;
        B.p._0_4_ = 0x10001;
        local_80 = (undefined1  [8])&B.s;
        B._8_8_ = uVar10;
        iVar5 = add_sub_mpi(X,(mbedtls_mpi *)local_50,(mbedtls_mpi *)local_80,1);
        if (iVar5 != 0) goto LAB_0021b59b;
        lVar9 = lVar9 + 1;
      } while (T._8_8_ != lVar9);
    }
  }
  iVar5 = 0;
  if ((cVar2 == '-') && (sVar6 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n), sVar6 != 0)) {
    X->s = -1;
  }
LAB_0021b59b:
  if (local_50 != (undefined1  [8])0x0) {
    mbedtls_zeroize_and_free((void *)local_50,(ulong)T.p._2_2_ << 3);
  }
  return iVar5;
LAB_0021b6d5:
  iVar5 = -6;
  goto LAB_0021b59b;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(s != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}